

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::RuntimeCharSet<char16_t>::CloneFrom
          (RuntimeCharSet<char16_t> *this,ArenaAllocator *allocator,CharSet<char16_t> *other)

{
  CharBitvec *this_00;
  code *pcVar1;
  bool bVar2;
  int w;
  uint uVar3;
  uint uVar4;
  int iVar5;
  undefined4 *puVar6;
  CharSetInner *this_01;
  undefined4 extraout_var;
  CharSetNode *pCVar7;
  long lVar8;
  uint i;
  undefined4 extraout_var_00;
  
  if (this->root != (CharSetNode *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x6e9,"(root == nullptr)","root == nullptr");
    if (!bVar2) goto LAB_00e720ba;
    *puVar6 = 0;
  }
  this_00 = &this->direct;
  uVar3 = CharBitvec::Count(this_00);
  if (uVar3 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x6ea,"(direct.Count() == 0)","direct.Count() == 0");
    if (!bVar2) {
LAB_00e720ba:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  if (4 < (other->rep).compact.countPlusOne - 1) {
    pCVar7 = (other->rep).full.root;
    if (pCVar7 == (CharSetNode *)0x0) {
      pCVar7 = (CharSetNode *)0x0;
    }
    else {
      iVar5 = (*pCVar7->_vptr_CharSetNode[1])(pCVar7,allocator);
      pCVar7 = (CharSetNode *)CONCAT44(extraout_var_00,iVar5);
    }
    this->root = pCVar7;
    lVar8 = 0;
    do {
      this_00->vec[lVar8] = *(uint32 *)((long)&other->rep + lVar8 * 4 + 8);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 8);
    return;
  }
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  uVar3 = 0;
  do {
    if (4 < (other->rep).compact.countPlusOne - 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                         ,0x1ef,"(IsCompact())","IsCompact()");
      if (!bVar2) goto LAB_00e720ba;
      *puVar6 = 0;
    }
    if (*(int *)&other->rep - 1U <= uVar3) {
      return;
    }
    uVar4 = CharSet<char16_t>::GetCompactCharU(other,uVar3);
    if (uVar4 < 0x100) {
      this_00->vec[uVar4 >> 5] = this_00->vec[uVar4 >> 5] | 1 << ((byte)uVar4 & 0x1f);
    }
    else {
      if (this->root == (CharSetNode *)0x0) {
        this_01 = (CharSetInner *)new<Memory::ArenaAllocator>(0x88,allocator,0x366bee);
        CharSetInner::CharSetInner(this_01);
        this->root = (CharSetNode *)this_01;
      }
      iVar5 = (*this->root->_vptr_CharSetNode[2])(this->root,allocator,2,(ulong)uVar4,(ulong)uVar4);
      if ((CharSetNode *)CONCAT44(extraout_var,iVar5) != this->root) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                           ,0x6fd,"(newRoot == root)","newRoot == root");
        if (!bVar2) goto LAB_00e720ba;
        *puVar6 = 0;
      }
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

void RuntimeCharSet<char16>::CloneFrom(ArenaAllocator* allocator, const CharSet<Char>& other)
    {
        Assert(root == nullptr);
        Assert(direct.Count() == 0);
        if (other.IsCompact())
        {
            for (uint i = 0; i < other.GetCompactLength(); i++)
            {
                uint k = other.GetCompactCharU(i);
                if (k < CharSetNode::directSize)
                    direct.Set(k);
                else
                {
                    if (root == nullptr)
                        root = Anew(allocator, CharSetInner);
#if DBG
                    CharSetNode* newRoot =
#endif
                    root->Set(allocator, CharSetNode::levels - 1, k, k);
#if DBG
                    // NOTE: Since we can add at most MaxCompact characters, we can never fill a leaf or inner node,
                    //       thus we will never need to reallocated nodes
                    Assert(newRoot == root);
#endif
                }
            }
        }
        else
        {
            root = other.rep.full.root == nullptr ? nullptr : other.rep.full.root->Clone(allocator);
            direct.CloneFrom(other.rep.full.direct);
        }
    }